

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::scaleRow(Highs *this,HighsInt row,double scale_value)

{
  HighsStatus HVar1;
  HighsInt unaff_retaddr;
  Highs *in_stack_00000008;
  HighsStatus call_status;
  HighsStatus return_status;
  HighsLogOptions *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  allocator local_a9;
  string local_a8 [8];
  string *in_stack_ffffffffffffff60;
  HighsStatus in_stack_ffffffffffffff68;
  HighsStatus in_stack_ffffffffffffff6c;
  Highs *in_stack_ffffffffffffff70;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  clearDerivedModelProperties
            ((Highs *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  scaleRowInterface(in_stack_00000008,unaff_retaddr,
                    (double)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  HighsLogOptions::HighsLogOptions
            ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"scaleRow",&local_a9);
  HVar1 = interpretCallStatus((HighsLogOptions *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c
                              ,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x497ba6);
  if (HVar1 == kError) {
    HVar1 = kError;
  }
  else {
    HVar1 = returnFromHighs(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  return HVar1;
}

Assistant:

HighsStatus Highs::scaleRow(const HighsInt row, const double scale_value) {
  HighsStatus return_status = HighsStatus::kOk;
  clearDerivedModelProperties();
  HighsStatus call_status = scaleRowInterface(row, scale_value);
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "scaleRow");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}